

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::CommandLineInterface::MemoryOutputStream::~MemoryOutputStream
          (MemoryOutputStream *this)

{
  string *insertion_content;
  StringOutputStream *pSVar1;
  GeneratorContextImpl *pGVar2;
  int iVar3;
  ostream *poVar4;
  reference ppVar5;
  ulong uVar6;
  long lVar7;
  Nonnull<const_char_*> failure_msg;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  pointer pcVar9;
  size_type sVar10;
  ulong uVar11;
  char *v2;
  size_t in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  size_type sVar13;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  string_view format;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  it;
  string indent_;
  string magic_string;
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>,_bool>
  pair;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  local_108;
  ulong local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  ulong local_e0;
  long *local_d8;
  size_t local_d0;
  long local_c8 [2];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  long *local_78;
  pointer local_70;
  long local_68 [2];
  LogMessageFatal local_58;
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>,_bool>
  local_48;
  
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__MemoryOutputStream_0196abe8;
  pSVar1 = (this->inner_)._M_t.
           super___uniq_ptr_impl<google::protobuf::io::StringOutputStream,_std::default_delete<google::protobuf::io::StringOutputStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::io::StringOutputStream_*,_std::default_delete<google::protobuf::io::StringOutputStream>_>
           .super__Head_base<0UL,_google::protobuf::io::StringOutputStream_*,_false>._M_head_impl;
  (this->inner_)._M_t.
  super___uniq_ptr_impl<google::protobuf::io::StringOutputStream,_std::default_delete<google::protobuf::io::StringOutputStream>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::io::StringOutputStream_*,_std::default_delete<google::protobuf::io::StringOutputStream>_>
  .super__Head_base<0UL,_google::protobuf::io::StringOutputStream_*,_false>._M_head_impl =
       (StringOutputStream *)0x0;
  if (pSVar1 != (StringOutputStream *)0x0) {
    operator_delete(pSVar1,0x10);
  }
  pGVar2 = this->directory_;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_(&)[1],_true>
            (&local_b8,&this->filename_,(char (*) [1])(anon_var_dwarf_a12c75 + 5));
  absl::lts_20250127::container_internal::
  btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>
  ::insert_unique<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>>
            (&local_48,
             (btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>
              *)&pGVar2->files_,&local_b8.first,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.second._M_dataplus._M_p != &local_b8.second.field_2) {
    operator_delete(local_b8.second._M_dataplus._M_p,
                    local_b8.second.field_2._M_allocated_capacity + 1);
  }
  paVar8 = &local_b8.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.first._M_dataplus._M_p != paVar8) {
    operator_delete(local_b8.first._M_dataplus._M_p,
                    CONCAT71(local_b8.first.field_2._M_allocated_capacity._1_7_,
                             local_b8.first.field_2._M_local_buf[0]) + 1);
  }
  local_108.node_ = local_48.first.node_;
  local_108.position_ = local_48.first.position_;
  local_108._12_4_ = local_48.first._12_4_;
  if ((this->insertion_point_)._M_string_length == 0) {
    if (local_48.second != false) {
      ppVar5 = absl::lts_20250127::container_internal::
               btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
               ::operator*(&local_108);
      std::__cxx11::string::swap((string *)&ppVar5->second);
      goto LAB_00d7ad91;
    }
    if (this->append_mode_ == true) {
      ppVar5 = absl::lts_20250127::container_internal::
               btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
               ::operator*(&local_108);
      std::__cxx11::string::_M_append((char *)&ppVar5->second,(ulong)(this->data_)._M_dataplus._M_p)
      ;
      goto LAB_00d7ad91;
    }
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->filename_)._M_dataplus._M_p,
                        (this->filename_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,": Tried to write the same file twice.",0x25);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  else {
    insertion_content = &this->data_;
    sVar13 = (this->data_)._M_string_length;
    if ((sVar13 != 0) && ((insertion_content->_M_dataplus)._M_p[sVar13 - 1] != '\n')) {
      std::__cxx11::string::push_back((char)insertion_content);
    }
    if (local_48.second == false) {
      ppVar5 = absl::lts_20250127::container_internal::
               btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
               ::operator*(&local_108);
      local_70 = (this->insertion_point_)._M_dataplus._M_p;
      local_78 = (long *)(this->insertion_point_)._M_string_length;
      local_b8.first._M_string_length = 0;
      local_b8.first.field_2._M_local_buf[0] = '\0';
      format._M_str = (char *)&local_78;
      format._M_len = (size_t)"@@protoc_insertion_point($0)";
      local_b8.first._M_dataplus._M_p = (pointer)paVar8;
      absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                ((substitute_internal *)&local_b8,(Nonnull<std::string_*>)&DAT_0000001c,format,
                 (Nullable<const_absl::string_view_*>)0x1,in_R9);
      pbVar12 = &ppVar5->second;
      uVar6 = std::__cxx11::string::find((char *)pbVar12,(ulong)local_b8.first._M_dataplus._M_p,0);
      if (uVar6 == 0xffffffffffffffff) {
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(this->filename_)._M_dataplus._M_p,
                            (this->filename_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,": insertion point \"",0x13);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(this->insertion_point_)._M_dataplus._M_p,
                            (this->insertion_point_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" not found.",0xc);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        this->directory_->had_error_ = true;
      }
      else {
        if (uVar6 < 4) {
          bVar16 = false;
        }
        else {
          std::__cxx11::string::substr((ulong)&local_78,(ulong)pbVar12);
          iVar3 = std::__cxx11::string::compare((char *)&local_78);
          bVar16 = iVar3 == 0;
          if (local_78 != local_68) {
            operator_delete(local_78,local_68[0] + 1);
          }
        }
        if (bVar16) {
          uVar6 = uVar6 - 3;
        }
        else {
          lVar7 = std::__cxx11::string::rfind((char)pbVar12,10);
          uVar6 = lVar7 + 1;
        }
        lVar7 = std::__cxx11::string::find_first_not_of((char *)pbVar12,0x12b2d1d,uVar6);
        std::__cxx11::string::string((string *)&local_d8,(string *)pbVar12,uVar6,lVar7 - uVar6);
        if (local_d0 == 0) {
          std::__cxx11::string::replace
                    ((ulong)pbVar12,uVar6,(char *)0x0,(ulong)(this->data_)._M_dataplus._M_p);
          sVar13 = (this->data_)._M_string_length;
          local_d0 = 0;
        }
        else {
          sVar13 = (this->data_)._M_string_length;
          uVar15 = 0;
          if (sVar13 != 0) {
            sVar10 = 0;
            do {
              iVar3 = 0;
              if ((insertion_content->_M_dataplus)._M_p[sVar10] == '\n') {
                iVar3 = (int)local_d0;
              }
              uVar14 = (int)uVar15 + iVar3;
              uVar15 = (ulong)uVar14;
              sVar10 = sVar10 + 1;
            } while (sVar13 != sVar10);
            uVar15 = (ulong)(int)uVar14;
          }
          std::__cxx11::string::insert((ulong)pbVar12,uVar6,(char)sVar13 + (char)uVar15);
          pcVar9 = (pbVar12->_M_dataplus)._M_p + uVar6;
          uVar11 = (this->data_)._M_string_length;
          local_f0 = uVar15;
          local_e8 = pbVar12;
          local_e0 = uVar6;
          if (uVar11 != 0) {
            uVar6 = 0;
            do {
              memcpy(pcVar9,local_d8,local_d0);
              pcVar9 = pcVar9 + local_d0;
              lVar7 = std::__cxx11::string::find((char)insertion_content,10);
              uVar15 = lVar7 + 1;
              memcpy(pcVar9,(this->data_)._M_dataplus._M_p + uVar6,uVar15 - uVar6);
              pcVar9 = pcVar9 + (uVar15 - uVar6);
              uVar11 = (this->data_)._M_string_length;
              uVar6 = uVar15;
            } while (uVar15 < uVar11);
          }
          uVar6 = local_e0;
          uVar15 = local_f0;
          v2 = (local_e8->_M_dataplus)._M_p + uVar11 + local_f0 + local_e0;
          if (pcVar9 == v2) {
            failure_msg = (Nonnull<const_char_*>)0x0;
          }
          else {
            failure_msg = absl::lts_20250127::log_internal::
                          MakeCheckOpString<char_const*,char_const*>
                                    (pcVar9,v2,
                                     "target_ptr == &(*target)[pos] + data_.size() + indent_size");
          }
          if (failure_msg != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      (&local_58,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                       ,0x3ab,failure_msg);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_58);
          }
          sVar13 = uVar15 + (this->data_)._M_string_length;
        }
        UpdateMetadata(this,insertion_content,uVar6,sVar13,local_d0);
        if (local_d8 != local_c8) {
          operator_delete(local_d8,local_c8[0] + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.first._M_dataplus._M_p != &local_b8.first.field_2) {
        operator_delete(local_b8.first._M_dataplus._M_p,
                        CONCAT71(local_b8.first.field_2._M_allocated_capacity._1_7_,
                                 local_b8.first.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_00d7ad91;
    }
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->filename_)._M_dataplus._M_p,
                        (this->filename_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,": Tried to insert into file that doesn\'t exist.",0x2f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  this->directory_->had_error_ = true;
LAB_00d7ad91:
  GeneratedCodeInfo::~GeneratedCodeInfo(&this->info_to_insert_);
  pSVar1 = (this->inner_)._M_t.
           super___uniq_ptr_impl<google::protobuf::io::StringOutputStream,_std::default_delete<google::protobuf::io::StringOutputStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::io::StringOutputStream_*,_std::default_delete<google::protobuf::io::StringOutputStream>_>
           .super__Head_base<0UL,_google::protobuf::io::StringOutputStream_*,_false>._M_head_impl;
  if (pSVar1 != (StringOutputStream *)0x0) {
    operator_delete(pSVar1,0x10);
  }
  (this->inner_)._M_t.
  super___uniq_ptr_impl<google::protobuf::io::StringOutputStream,_std::default_delete<google::protobuf::io::StringOutputStream>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::io::StringOutputStream_*,_std::default_delete<google::protobuf::io::StringOutputStream>_>
  .super__Head_base<0UL,_google::protobuf::io::StringOutputStream_*,_false>._M_head_impl =
       (StringOutputStream *)0x0;
  pcVar9 = (this->data_)._M_dataplus._M_p;
  paVar8 = &(this->data_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar9 != paVar8) {
    operator_delete(pcVar9,paVar8->_M_allocated_capacity + 1);
  }
  pcVar9 = (this->insertion_point_)._M_dataplus._M_p;
  paVar8 = &(this->insertion_point_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar9 != paVar8) {
    operator_delete(pcVar9,paVar8->_M_allocated_capacity + 1);
  }
  pcVar9 = (this->filename_)._M_dataplus._M_p;
  paVar8 = &(this->filename_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar9 != paVar8) {
    operator_delete(pcVar9,paVar8->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

CommandLineInterface::MemoryOutputStream::~MemoryOutputStream() {
  // Make sure all data has been written.
  inner_.reset();

  // Insert into the directory.
  auto pair = directory_->files_.insert({filename_, ""});
  auto it = pair.first;
  bool already_present = !pair.second;

  if (insertion_point_.empty()) {
    // This was just a regular Open().
    if (already_present) {
      if (append_mode_) {
        it->second.append(data_);
      } else {
        std::cerr << filename_ << ": Tried to write the same file twice."
                  << std::endl;
        directory_->had_error_ = true;
      }
      return;
    }

    it->second.swap(data_);
    return;
  }
  // This was an OpenForInsert().

  // If the data doesn't end with a clean line break, add one.
  if (!data_.empty() && data_[data_.size() - 1] != '\n') {
    data_.push_back('\n');
  }

  // Find the file we are going to insert into.
  if (!already_present) {
    std::cerr << filename_ << ": Tried to insert into file that doesn't exist."
              << std::endl;
    directory_->had_error_ = true;
    return;
  }
  std::string* target = &it->second;

  // Find the insertion point.
  std::string magic_string =
      absl::Substitute("@@protoc_insertion_point($0)", insertion_point_);
  std::string::size_type pos = target->find(magic_string);

  if (pos == std::string::npos) {
    std::cerr << filename_ << ": insertion point \"" << insertion_point_
              << "\" not found." << std::endl;
    directory_->had_error_ = true;
    return;
  }

  if ((pos > 3) && (target->substr(pos - 3, 2) == "/*")) {
    // Support for inline "/* @@protoc_insertion_point() */"
    pos = pos - 3;
  } else {
    // Seek backwards to the beginning of the line, which is where we will
    // insert the data.  Note that this has the effect of pushing the
    // insertion point down, so the data is inserted before it.  This is
    // intentional because it means that multiple insertions at the same point
    // will end up in the expected order in the final output.
    pos = target->find_last_of('\n', pos);
    if (pos == std::string::npos) {
      // Insertion point is on the first line.
      pos = 0;
    } else {
      // Advance to character after '\n'.
      ++pos;
    }
  }

  // Extract indent.
  std::string indent_(*target, pos,
                      target->find_first_not_of(" \t", pos) - pos);

  if (indent_.empty()) {
    // No indent.  This makes things easier.
    target->insert(pos, data_);
    UpdateMetadata(data_, pos, data_.size(), 0);
    return;
  }
  // Calculate how much space we need.
  int indent_size = 0;
  for (size_t i = 0; i < data_.size(); ++i) {
    if (data_[i] == '\n') indent_size += indent_.size();
  }

  // Make a hole for it.
  target->insert(pos, data_.size() + indent_size, '\0');

  // Now copy in the data.
  std::string::size_type data_pos = 0;
  char* target_ptr = &(*target)[pos];
  while (data_pos < data_.size()) {
    // Copy indent.
    memcpy(target_ptr, indent_.data(), indent_.size());
    target_ptr += indent_.size();

    // Copy line from data_.
    // We already guaranteed that data_ ends with a newline (above), so this
    // search can't fail.
    std::string::size_type line_length =
        data_.find_first_of('\n', data_pos) + 1 - data_pos;
    memcpy(target_ptr, data_.data() + data_pos, line_length);
    target_ptr += line_length;
    data_pos += line_length;
  }

  ABSL_CHECK_EQ(target_ptr, &(*target)[pos] + data_.size() + indent_size);

  UpdateMetadata(data_, pos, data_.size() + indent_size, indent_.size());
}